

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_TestShell::createTest
          (TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x225);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035c270;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorListTest, clearAllAccountingIsWorkingProperly)
{
    MemoryLeakDetectorList listForTesting;
    MemoryLeakDetectorNode node1, node2, node3;
    node3.period_ = mem_leak_period_disabled;
    listForTesting.addNewNode(&node1);
    listForTesting.addNewNode(&node2);
    listForTesting.addNewNode(&node3);

    listForTesting.clearAllAccounting(mem_leak_period_enabled);

    POINTERS_EQUAL(NULLPTR, listForTesting.getFirstLeak(mem_leak_period_enabled));
    CHECK(&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled));
}